

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O1

int YP_md_get_parameter(YPSpur *spur,int param_id,double *value)

{
  int iVar1;
  YPSpur_msg msg;
  YPSpur_msg local_48;
  
  local_48.msg_type = 1;
  local_48.pid = (long)spur->pid;
  local_48.type = 0x101;
  local_48.cs = param_id;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_48);
  if ((-1 < iVar1) && (iVar1 = (*(spur->dev).recv)(&spur->dev,&local_48), -1 < iVar1)) {
    *value = local_48.data[0];
    return local_48.cs;
  }
  spur->connection_error = 1;
  return -1;
}

Assistant:

int YP_md_get_parameter(YPSpur* spur, int param_id, double* value)
{
  YPSpur_msg msg;
  int len;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_PARAM_GET;
  msg.cs = param_id;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  *value = msg.data[0];
  return msg.cs;
}